

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

int32 ngram_prob(ngram_model_t *model,char **words,int32 n)

{
  int32 iVar1;
  int32 *history;
  long lVar2;
  int32 nused;
  int32 local_34;
  
  history = (int32 *)__ckd_calloc__((long)(n + -1),4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x20d);
  if (1 < (uint)n) {
    lVar2 = 0;
    do {
      iVar1 = ngram_wid(model,words[lVar2 + 1]);
      history[lVar2] = iVar1;
      lVar2 = lVar2 + 1;
    } while ((ulong)(uint)n - 1 != lVar2);
  }
  iVar1 = ngram_wid(model,*words);
  iVar1 = ngram_ng_prob(model,iVar1,history,n + -1,&local_34);
  ckd_free(history);
  return iVar1;
}

Assistant:

int32
ngram_prob(ngram_model_t * model, const char* const *words, int32 n)
{
    int32 *ctx_id;
    int32 nused;
    int32 prob;
    int32 wid;
    uint32 i;

    ctx_id = (int32 *) ckd_calloc(n - 1, sizeof(*ctx_id));
    for (i = 1; i < (uint32) n; ++i)
        ctx_id[i - 1] = ngram_wid(model, words[i]);

    wid = ngram_wid(model, *words);
    prob = ngram_ng_prob(model, wid, ctx_id, n - 1, &nused);
    ckd_free(ctx_id);

    return prob;
}